

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

ErrorStackOption * __thiscall
ritobin::io::json_impl::json_value_impl<ritobin::Map,_(ritobin::Category)7>::from_json
          (ErrorStackOption *__return_storage_ptr__,
          json_value_impl<ritobin::Map,_(ritobin::Category)7> *this,Map *value,json *json)

{
  bool bVar1;
  const_reference pvVar2;
  reference this_00;
  reference value_00;
  size_t index;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string_view type_name;
  string_view type_name_00;
  string valueType_name;
  string keyType_name;
  const_iterator __end3;
  const_iterator __begin3;
  allocator<char> local_191;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [2];
  json_impl *local_148;
  json_value_impl<ritobin::Map,_(ritobin::Category)7> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  if (value->keyType == BOOL) {
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[10],_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)value,(char (*) [10])"valueType");
    if (bVar1) {
      bVar1 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[8],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)value,(char (*) [8])"keyType");
      if (bVar1) {
        bVar1 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::contains<const_char_(&)[6],_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)value,(char (*) [6])"items");
        if (bVar1) {
          pvVar2 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)value,"valueType");
          if (pvVar2->m_type == string) {
            pvVar2 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)value,"keyType");
            if (pvVar2->m_type == string) {
              pvVar2 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                   *)value,"items");
              if (pvVar2->m_type == array) {
                pvVar2 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)value,"keyType");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118,pvVar2);
                pvVar2 = nlohmann::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ::operator[]<char_const>
                                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                     *)value,"valueType");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::
                get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_138,pvVar2);
                type_name._M_str = (char *)this;
                type_name._M_len = local_118[0]._M_allocated_capacity;
                bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                        ::try_type_name_to_type
                                  ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                    *)local_118[0]._8_8_,type_name,&json->m_type);
                if (bVar1) {
                  type_name_00._M_str = (char *)(this + 1);
                  type_name_00._M_len = (size_t)local_138._M_dataplus._M_p;
                  bVar1 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                          ::try_type_name_to_type
                                    ((ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                                      *)local_138._M_string_length,type_name_00,&json->m_type);
                  if (!bVar1) {
                    local_190._8_8_ =
                         "ValueHelper::try_type_name_to_type(valueType_name, value.valueType)";
                    goto LAB_0011e2a8;
                  }
                  pvVar2 = nlohmann::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                       *)value,"items");
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::cbegin(&local_50,pvVar2);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::cend(&local_70,pvVar2);
                  local_140 = this + 8;
                  local_148 = (json_impl *)0x0;
                  while (bVar1 = nlohmann::detail::
                                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::operator!=(&local_50,&local_70), bVar1) {
                    this_00 = nlohmann::detail::
                              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ::operator*(&local_50);
                    ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                    ::type_to_value((Value *)local_190,(Type)*this);
                    ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                    ::type_to_value((Value *)local_f8,(Type)this[1]);
                    value_00 = std::vector<ritobin::Pair,std::allocator<ritobin::Pair>>::
                               emplace_back<std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>
                                         ((vector<ritobin::Pair,std::allocator<ritobin::Pair>> *)
                                          local_140,(Value *)local_190,
                                          (variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                           *)local_f8);
                    std::__detail::__variant::
                    _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                    ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         *)local_f8);
                    std::__detail::__variant::
                    _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                    ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                         *)local_190);
                    if (this_00->m_type == object) {
                      bVar1 = nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::contains<const_char_(&)[4],_0>(this_00,(char (*) [4])0x12f464);
                      if (!bVar1) {
                        local_190._8_8_ = "json.contains(\"key\")";
                        goto LAB_0011e0ca;
                      }
                      bVar1 = nlohmann::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::contains<const_char_(&)[6],_0>(this_00,(char (*) [6])"value");
                      if (!bVar1) {
                        local_190._8_8_ = "json.contains(\"value\")";
                        goto LAB_0011e0ca;
                      }
                      pvVar2 = nlohmann::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           *)this_00,"key");
                      value_from_json(__return_storage_ptr__,&value_00->key,pvVar2);
                      if ((__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_engaged == true) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_f8[0]._M_local_buf,"key",&local_191);
LAB_0011e145:
                        paVar3 = local_f8;
                        to_index((string *)local_190,(string *)paVar3);
                        ErrorStack::push((ErrorStack *)__return_storage_ptr__,(string *)local_190);
                        std::__cxx11::string::~string((string *)local_190);
                        goto LAB_0011e0d4;
                      }
                      std::_Optional_payload_base<ritobin::io::json_impl::ErrorStack>::_M_reset
                                ((_Optional_payload_base<ritobin::io::json_impl::ErrorStack> *)
                                 __return_storage_ptr__);
                      pvVar2 = nlohmann::
                               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               ::operator[]<char_const>
                                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                           *)this_00,"value");
                      value_from_json(__return_storage_ptr__,&value_00->value,pvVar2);
                      if ((__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_engaged == true) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_f8[0]._M_local_buf,"value",&local_191);
                        goto LAB_0011e145;
                      }
                      std::_Optional_payload_base<ritobin::io::json_impl::ErrorStack>::_M_reset
                                ((_Optional_payload_base<ritobin::io::json_impl::ErrorStack> *)
                                 __return_storage_ptr__);
                      (__return_storage_ptr__->
                      super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                      _M_payload.
                      super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                      .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged =
                           false;
                    }
                    else {
                      local_190._8_8_ = "json.is_object()";
LAB_0011e0ca:
                      local_180._M_allocated_capacity = (size_type)local_170;
                      local_170[0]._M_local_buf[0] = '\0';
                      local_180._8_8_ = 0;
                      local_190._0_8_ = "pair";
                      std::optional<ritobin::io::json_impl::ErrorStack>::
                      optional<ritobin::io::json_impl::ErrorStack,_true>
                                (__return_storage_ptr__,(ErrorStack *)local_190);
                      paVar3 = &local_180;
LAB_0011e0d4:
                      std::__cxx11::string::~string((string *)paVar3->_M_local_buf);
                    }
                    if ((__return_storage_ptr__->
                        super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                        _M_payload.
                        super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                        .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged
                        == true) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_b0[0]._M_local_buf,"items",&local_191);
                      to_index((string *)local_190,(string *)local_b0);
                      to_index_abi_cxx11_((string *)local_f8,local_148,index);
                      std::operator+(&local_90,(string *)local_190,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_f8);
                      ErrorStack::push((ErrorStack *)__return_storage_ptr__,&local_90);
                      std::__cxx11::string::~string((string *)&local_90);
                      std::__cxx11::string::~string((string *)local_f8[0]._M_local_buf);
                      std::__cxx11::string::~string((string *)local_190);
                      paVar3 = local_b0;
                      goto LAB_0011e2cd;
                    }
                    std::_Optional_payload_base<ritobin::io::json_impl::ErrorStack>::_M_reset
                              ((_Optional_payload_base<ritobin::io::json_impl::ErrorStack> *)
                               __return_storage_ptr__);
                    local_148 = local_148 + 1;
                    nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator++(&local_50);
                  }
                  (__return_storage_ptr__->
                  super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload
                  .super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
                  super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged =
                       false;
                }
                else {
                  local_190._8_8_ =
                       "ValueHelper::try_type_name_to_type(keyType_name, value.keyType)";
LAB_0011e2a8:
                  local_190._0_8_ = "map";
                  paVar3 = &local_180;
                  local_180._M_allocated_capacity = (size_type)local_170;
                  local_180._8_8_ = 0;
                  local_170[0]._M_local_buf[0] = '\0';
                  std::optional<ritobin::io::json_impl::ErrorStack>::
                  optional<ritobin::io::json_impl::ErrorStack,_true>
                            (__return_storage_ptr__,(ErrorStack *)local_190);
LAB_0011e2cd:
                  std::__cxx11::string::~string((string *)paVar3->_M_local_buf);
                }
                std::__cxx11::string::~string((string *)&local_138);
                paVar3 = local_118;
                goto LAB_0011e25e;
              }
              local_190._8_8_ = "json[\"items\"].is_array()";
            }
            else {
              local_190._8_8_ = "json[\"keyType\"].is_string()";
            }
          }
          else {
            local_190._8_8_ = "json[\"valueType\"].is_string()";
          }
        }
        else {
          local_190._8_8_ = "json.contains(\"items\")";
        }
      }
      else {
        local_190._8_8_ = "json.contains(\"keyType\")";
      }
    }
    else {
      local_190._8_8_ = "json.contains(\"valueType\")";
    }
  }
  else {
    local_190._8_8_ = "json.is_object()";
  }
  local_190._0_8_ = "map";
  paVar3 = &local_180;
  local_180._M_allocated_capacity = (size_type)local_170;
  local_180._8_8_ = 0;
  local_170[0]._M_local_buf[0] = '\0';
  std::optional<ritobin::io::json_impl::ErrorStack>::
  optional<ritobin::io::json_impl::ErrorStack,_true>(__return_storage_ptr__,(ErrorStack *)local_190)
  ;
LAB_0011e25e:
  std::__cxx11::string::~string((string *)paVar3->_M_local_buf);
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_object());
            bin_json_assert(json.contains("valueType"));
            bin_json_assert(json.contains("keyType"));
            bin_json_assert(json.contains("items"));
            bin_json_assert(json["valueType"].is_string());
            bin_json_assert(json["keyType"].is_string());
            bin_json_assert(json["items"].is_array());
            std::string keyType_name = json["keyType"];
            std::string valueType_name = json["valueType"];
            bin_json_assert(ValueHelper::try_type_name_to_type(keyType_name, value.keyType));
            bin_json_assert(ValueHelper::try_type_name_to_type(valueType_name, value.valueType));
            auto const& json_items = json["items"];
            size_t index = 0;
            for (auto const& json_item: json_items) {
                auto& value_item = value.items.emplace_back(ValueHelper::type_to_value(value.keyType),
                                                            ValueHelper::type_to_value(value.valueType));
                bin_json_rethrow(to_index("items") + to_index(index),
                                 item_from_json(value_item, json_item));
                ++index;
            }
            return std::nullopt;
        }